

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

int amqpvalue_set_list_item(AMQP_VALUE value,uint32_t index,AMQP_VALUE list_item_value)

{
  size_t __size;
  void *pvVar1;
  AMQP_VALUE pAVar2;
  LOGGER_LOG p_Var3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (value == (AMQP_VALUE)0x0) {
    p_Var3 = xlogging_get_log_function();
    iVar5 = 0x572;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x572;
    }
    pcVar6 = "NULL list value";
    iVar4 = 0x571;
  }
  else if (value->type == AMQP_TYPE_LIST) {
    uVar8 = (ulong)index;
    amqpvalue_clone(list_item_value);
    if (list_item_value != (AMQP_VALUE)0x0) {
      if (index < (value->value).binary_value.length) {
        amqpvalue_destroy(*(AMQP_VALUE *)
                           (&((value->value).described_value.descriptor)->type + uVar8 * 2));
        *(AMQP_VALUE *)(&((value->value).described_value.descriptor)->type + uVar8 * 2) =
             list_item_value;
      }
      else {
        __size = uVar8 * 8 + 8;
        pvVar1 = realloc((value->value).binary_value.bytes,__size);
        if (pvVar1 == (void *)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                      ,"amqpvalue_set_list_item",0x592,1,
                      "Could not reallocate list storage, size:%zu",__size);
          }
          amqpvalue_destroy(list_item_value);
          return 0x594;
        }
        (value->value).binary_value.bytes = pvVar1;
        for (uVar7 = (ulong)(value->value).binary_value.length; uVar7 < uVar8; uVar7 = uVar7 + 1) {
          pAVar2 = amqpvalue_create_null();
          *(AMQP_VALUE *)((long)pvVar1 + uVar7 * 8) = pAVar2;
          if (pAVar2 == (AMQP_VALUE)0x0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                        ,"amqpvalue_set_list_item",0x5a1,1,
                        "Could not allocate NULL value for list entries");
            }
            for (uVar8 = (ulong)(value->value).binary_value.length; uVar8 < (uVar7 & 0xffffffff);
                uVar8 = uVar8 + 1) {
              amqpvalue_destroy(*(AMQP_VALUE *)((long)pvVar1 + uVar8 * 8));
            }
            amqpvalue_destroy(list_item_value);
            return 0x5b3;
          }
        }
        (value->value).binary_value.length = index + 1;
        *(AMQP_VALUE *)(&((value->value).described_value.descriptor)->type + uVar8 * 2) =
             list_item_value;
      }
      return 0;
    }
    p_Var3 = xlogging_get_log_function();
    iVar5 = 0x585;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x585;
    }
    pcVar6 = "Could not clone list item";
    iVar4 = 0x584;
  }
  else {
    p_Var3 = xlogging_get_log_function();
    iVar5 = 0x57a;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x57a;
    }
    pcVar6 = "Value is not of type LIST";
    iVar4 = 0x579;
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
            ,"amqpvalue_set_list_item",iVar4,1,pcVar6);
  return iVar5;
}

Assistant:

int amqpvalue_set_list_item(AMQP_VALUE value, uint32_t index, AMQP_VALUE list_item_value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_165: [If value or list_item_value is NULL, amqpvalue_set_list_item shall fail and return a non-zero value.] */
    if (value == NULL)
    {
        LogError("NULL list value");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        if (value_data->type != AMQP_TYPE_LIST)
        {
            LogError("Value is not of type LIST");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_168: [The item stored at the index-th position in the list shall be a clone of list_item_value.] */
            AMQP_VALUE cloned_item = amqpvalue_clone(list_item_value);
            if (cloned_item == NULL)
            {
                /* Codes_SRS_AMQPVALUE_01_170: [When amqpvalue_set_list_item fails due to not being able to clone the item or grow the list, the list shall not be altered.] */
                /* Codes_SRS_AMQPVALUE_01_169: [If cloning the item fails, amqpvalue_set_list_item shall fail and return a non-zero value.] */
                LogError("Could not clone list item");
                result = MU_FAILURE;
            }
            else
            {
                if (index >= value_data->value.list_value.count)
                {
                    AMQP_VALUE* new_list;
                    size_t realloc_size = safe_add_size_t((size_t)index, 1);
                    realloc_size = safe_multiply_size_t(realloc_size, sizeof(AMQP_VALUE));
                    if (realloc_size == SIZE_MAX ||
                        (new_list = (AMQP_VALUE*)realloc(value_data->value.list_value.items, realloc_size)) == NULL)
                    {
                        /* Codes_SRS_AMQPVALUE_01_170: [When amqpvalue_set_list_item fails due to not being able to clone the item or grow the list, the list shall not be altered.] */
                        LogError("Could not reallocate list storage, size:%zu", realloc_size);
                        amqpvalue_destroy(cloned_item);
                        result = MU_FAILURE;
                    }
                    else
                    {
                        uint32_t i;

                        value_data->value.list_value.items = new_list;

                        for (i = value_data->value.list_value.count; i < index; i++)
                        {
                            new_list[i] = amqpvalue_create_null();
                            if (new_list[i] == NULL)
                            {
                                LogError("Could not allocate NULL value for list entries");
                                break;
                            }
                        }

                        if (i < index)
                        {
                            /* Codes_SRS_AMQPVALUE_01_170: [When amqpvalue_set_list_item fails due to not being able to clone the item or grow the list, the list shall not be altered.] */
                            uint32_t j;

                            for (j = value_data->value.list_value.count; j < i; j++)
                            {
                                amqpvalue_destroy(new_list[j]);
                            }

                            amqpvalue_destroy(cloned_item);

                            /* Codes_SRS_AMQPVALUE_01_172: [If growing the list fails, then amqpvalue_set_list_item shall fail and return a non-zero value.] */
                            result = MU_FAILURE;
                        }
                        else
                        {
                            value_data->value.list_value.count = index + 1;
                            value_data->value.list_value.items[index] = cloned_item;

                            /* Codes_SRS_AMQPVALUE_01_164: [On success amqpvalue_set_list_item shall return 0.] */
                            result = 0;
                        }
                    }
                }
                else
                {
                    /* Codes_SRS_AMQPVALUE_01_167: [Any previous value stored at the position index in the list shall be freed by using amqpvalue_destroy.] */
                    amqpvalue_destroy(value_data->value.list_value.items[index]);

                    /* Codes_SRS_AMQPVALUE_01_163: [amqpvalue_set_list_item shall replace the item at the 0 based index-th position in the list identified by the value argument with the AMQP_VALUE specified by list_item_value.] */
                    value_data->value.list_value.items[index] = cloned_item;

                    /* Codes_SRS_AMQPVALUE_01_164: [On success amqpvalue_set_list_item shall return 0.] */
                    result = 0;
                }
            }
        }
    }

    return result;
}